

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_draw_config(t_radio *x,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _glist *p_Var4;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar7;
  undefined8 uVar6;
  int local_130;
  undefined4 local_128;
  int col;
  t_atom fontatoms [3];
  char tag [128];
  int local_70;
  int local_6c;
  int yy22;
  int yy21;
  int yy12;
  int yy11;
  int xx22;
  int xx21;
  int xx12;
  int xx11;
  int d4;
  int dy;
  int dx;
  int d;
  int yy11b;
  int xx11b;
  int ioh;
  int iow;
  _glist *canvas;
  t_iemgui *iemgui;
  int zoom;
  int i;
  _glist *glist_local;
  t_radio *x_local;
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  p_Var4 = glist_getcanvas(glist);
  iVar2 = text_xpix((t_text *)x,glist);
  iVar3 = text_ypix((t_text *)x,glist);
  d4 = 0;
  xx11 = 0;
  local_128 = 2;
  fontatoms[0]._0_8_ = gensym((x->x_gui).x_font);
  fontatoms[0].a_w.w_float = 1.4013e-45;
  fontatoms[1].a_type = (t_atomtype)(float)(-(x->x_gui).x_fontsize * iVar1);
  fontatoms[1].a_w.w_float = 2.8026e-45;
  fontatoms[2]._0_8_ = gensym(sys_fontweight);
  if (x->x_orientation == horizontal) {
    d4 = (x->x_gui).x_w;
    dy = d4;
  }
  else {
    xx11 = (x->x_gui).x_h;
    dy = xx11;
  }
  local_70 = dy / 4;
  xx22 = iVar2 + dy;
  yy11 = iVar2 + local_70;
  yy12 = xx22 - local_70;
  yy22 = iVar3 + dy;
  local_6c = iVar3 + local_70;
  local_70 = yy22 - local_70;
  yy21 = iVar3;
  xx21 = iVar2;
  for (iemgui._4_4_ = 0; uVar7 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
      uVar5 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20), iemgui._4_4_ < x->x_number;
      iemgui._4_4_ = iemgui._4_4_ + 1) {
    if (x->x_on == iemgui._4_4_) {
      local_130 = (x->x_gui).x_fcol;
    }
    else {
      local_130 = (x->x_gui).x_bcol;
    }
    sprintf((char *)&fontatoms[2].a_w.w_index,"%lxBASE%d",x);
    uVar6 = CONCAT44(uVar7,yy22);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",&fontatoms[2].a_w,(ulong)(uint)xx21,yy21,
                CONCAT44(uVar5,xx22),uVar6);
    uVar5 = 0;
    uVar6 = CONCAT44((int)((ulong)uVar6 >> 0x20),(x->x_gui).x_bcol);
    pdgui_vmess((char *)0x0,"crs ri rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-width",iVar1,
                "-fill",uVar6);
    uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
    sprintf((char *)&fontatoms[2].a_w.w_index,"%lxBUT%d",x);
    uVar6 = CONCAT44(uVar7,local_70);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",&fontatoms[2].a_w,(ulong)(uint)yy11,local_6c,
                CONCAT44(uVar5,yy12),uVar6);
    in_stack_fffffffffffffeb0 = 0;
    in_stack_fffffffffffffeb8 = CONCAT44((int)((ulong)uVar6 >> 0x20),local_130);
    pdgui_vmess((char *)0x0,"crs rk rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-fill",local_130,
                "-outline",in_stack_fffffffffffffeb8);
    xx21 = d4 + xx21;
    xx22 = d4 + xx22;
    yy11 = d4 + yy11;
    yy12 = d4 + yy12;
    yy21 = xx11 + yy21;
    yy22 = xx11 + yy22;
    local_6c = xx11 + local_6c;
    local_70 = xx11 + local_70;
    x->x_drawn = x->x_on;
  }
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var4,"coords",&fontatoms[2].a_w,
              (ulong)(uint)(iVar2 + (x->x_gui).x_ldx * iVar1),iVar3 + (x->x_gui).x_ldy * iVar1);
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-font",3,&local_128,
              "-fill",(x->x_gui).x_lcol);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void radio_draw_config(t_radio* x, t_glist* glist)
{
    int i;
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int xx11b = text_xpix(&x->x_gui.x_obj, glist);
    int yy11b = text_ypix(&x->x_gui.x_obj, glist);
    int d, dx = 0, dy = 0, d4;

    int xx11=xx11b, xx12=0, xx21=0, xx22=0;
    int yy11=yy11b, yy12=0, yy21=0, yy22=0;

    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    if(x->x_orientation == horizontal)
    {
        d = dx = x->x_gui.x_w;
    } else {
        d = dy = x->x_gui.x_h;
    }
    d4 = d / 4;
    xx12 = xx11 + d;
    xx21 = xx11 + d4;
    xx22 = xx12 - d4;
    yy12 = yy11 + d;
    yy21 = yy11 + d4;
    yy22 = yy12 - d4;

    for(i = 0; i < x->x_number; i++)
    {
        int col = (x->x_on == i) ? x->x_gui.x_fcol : x->x_gui.x_bcol;
        sprintf(tag, "%lxBASE%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx11, yy11, xx12, yy12);
        pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
            "-width", zoom, "-fill", x->x_gui.x_bcol);

        sprintf(tag, "%lxBUT%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx21, yy21, xx22, yy22);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", col, "-outline", col);
        xx11 += dx; xx12 += dx; xx21 += dx; xx22 += dx;
        yy11 += dy; yy12 += dy; yy21 += dy; yy22 += dy;

        x->x_drawn = x->x_on;
    }

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xx11b + x->x_gui.x_ldx * zoom, yy11b + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}